

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatbuffers.h
# Opt level: O2

Offset<flatbuffers::String> __thiscall
flatbuffers::FlatBufferBuilder::CreateString(FlatBufferBuilder *this,char *str,size_t len)

{
  NotNested(this);
  PreAlign<unsigned_int>(this,len + 1);
  vector_downward::fill(&this->buf_,1);
  vector_downward::push(&this->buf_,(uint8_t *)str,len);
  PushElement<unsigned_int>(this,(uint)len);
  return (Offset<flatbuffers::String>)
         (((int)(this->buf_).reserved_ - *(int *)&(this->buf_).cur_) + *(int *)&(this->buf_).buf_);
}

Assistant:

Offset<String> CreateString(const char *str, size_t len) {
    NotNested();
    PreAlign<uoffset_t>(len + 1);  // Always 0-terminated.
    buf_.fill(1);
    PushBytes(reinterpret_cast<const uint8_t *>(str), len);
    PushElement(static_cast<uoffset_t>(len));
    return Offset<String>(GetSize());
  }